

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O2

void __thiscall
cubeb_resampler_speex_one_way<float>::drop_audio_if_needed
          (cubeb_resampler_speex_one_way<float> *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar4;
  uint uVar3;
  
  uVar4 = (ulong)(this->super_processor).channels;
  uVar1 = this->source_rate / 0x14;
  uVar3 = (uint)((this->resampling_in_buffer).length_ / uVar4);
  uVar2 = uVar3 - uVar1;
  if (uVar1 <= uVar3 && uVar2 != 0) {
    auto_array<float>::pop(&this->resampling_in_buffer,(float *)0x0,uVar2 * uVar4);
    return;
  }
  return;
}

Assistant:

size_t length() const { return length_; }